

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O2

void swrenderer::R_SortVisSprites(_func_bool_vissprite_t_ptr_vissprite_t_ptr *compare,size_t first)

{
  int iVar1;
  long lVar2;
  vissprite_t **__first;
  long lVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  
  vsprcount = (uint)(vissprite_p - (first * 8 + vissprites) >> 3);
  if (vsprcount != 0) {
    if (spritesortersize < MaxVisSprites) {
      if (spritesorter != (vissprite_t **)0x0) {
        operator_delete__(spritesorter);
      }
      iVar1 = MaxVisSprites;
      uVar5 = 0xffffffffffffffff;
      if (-1 < MaxVisSprites) {
        uVar5 = (long)MaxVisSprites * 8;
      }
      spritesorter = (vissprite_t **)operator_new__(uVar5);
      spritesortersize = iVar1;
    }
    __first = spritesorter;
    lVar2 = firstvissprite;
    lVar3 = (long)(int)vsprcount;
    if ((i_compatflags._3_1_ & 8) == 0) {
      uVar5 = 0;
      uVar6 = 0;
      if (0 < (int)vsprcount) {
        uVar6 = (ulong)vsprcount;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        __first[uVar5] = *(vissprite_t **)(lVar2 + uVar5 * 8);
      }
    }
    else {
      uVar5 = 0;
      uVar6 = 0;
      if (0 < (int)vsprcount) {
        uVar6 = (ulong)vsprcount;
      }
      puVar4 = (undefined8 *)(firstvissprite + lVar3 * 8);
      for (; puVar4 = puVar4 + -1, uVar6 != uVar5; uVar5 = uVar5 + 1) {
        __first[uVar5] = (vissprite_t *)*puVar4;
      }
    }
    std::
    __stable_sort<swrenderer::vissprite_t**,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(swrenderer::vissprite_t*,swrenderer::vissprite_t*)>>
              (__first,__first + lVar3,
               (_Iter_comp_iter<bool_(*)(swrenderer::vissprite_t_*,_swrenderer::vissprite_t_*)>)
               compare);
    return;
  }
  return;
}

Assistant:

void R_SortVisSprites (bool (*compare)(vissprite_t *, vissprite_t *), size_t first)
{
	int i;
	vissprite_t **spr;

	vsprcount = int(vissprite_p - &vissprites[first]);

	if (vsprcount == 0)
		return;

	if (spritesortersize < MaxVisSprites)
	{
		if (spritesorter != NULL)
			delete[] spritesorter;
		spritesorter = new vissprite_t *[MaxVisSprites];
		spritesortersize = MaxVisSprites;
	}

	if (!(i_compatflags & COMPATF_SPRITESORT))
	{
		for (i = 0, spr = firstvissprite; i < vsprcount; i++, spr++)
		{
			spritesorter[i] = *spr;
		}
	}
	else
	{
		// If the compatibility option is on sprites of equal distance need to
		// be sorted in inverse order. This is most easily achieved by
		// filling the sort array backwards before the sort.
		for (i = 0, spr = firstvissprite + vsprcount-1; i < vsprcount; i++, spr--)
		{
			spritesorter[i] = *spr;
		}
	}

	std::stable_sort(&spritesorter[0], &spritesorter[vsprcount], compare);
}